

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VgaDebugGenerator.cpp
# Opt level: O0

void __thiscall VgaDebugGenerator::LoadTemplate(VgaDebugGenerator *this)

{
  byte bVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string *this_00;
  Template *pTVar3;
  allocator<char> local_289;
  undefined1 local_288 [8];
  optional<Template> temp_opt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long local_218;
  ifstream temp_fin;
  VgaDebugGenerator *this_local;
  
  std::ifstream::ifstream(&local_218,this,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if ((bVar1 & 1) != 0) {
    temp_opt.super__Optional_base<Template,_false,_false>._M_payload.
    super__Optional_payload<Template,_true,_false,_false>.super__Optional_payload_base<Template>.
    _55_1_ = 1;
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    std::operator+(&local_248,"Failed to open template file \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::operator+(__return_storage_ptr__,&local_248,"\'");
    temp_opt.super__Optional_base<Template,_false,_false>._M_payload.
    super__Optional_payload<Template,_true,_false,_false>.super__Optional_payload_base<Template>.
    _55_1_ = 0;
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  Template::From((optional<Template> *)local_288,(ifstream *)&local_218,(this->config).header_lines,
                 (this->config).template_width,(this->config).template_height);
  bVar2 = std::optional<Template>::has_value((optional<Template> *)local_288);
  if (!bVar2) {
    this_00 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,"Failed to parse template file due to above reasons",&local_289);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  pTVar3 = std::optional<Template>::value((optional<Template> *)local_288);
  Template::operator=(&this->templte,pTVar3);
  std::optional<Template>::~optional((optional<Template> *)local_288);
  std::ifstream::~ifstream(&local_218);
  return;
}

Assistant:

void VgaDebugGenerator::LoadTemplate() {
    std::ifstream temp_fin(config.template_file);
    if (!temp_fin) {
        throw "Failed to open template file '" + config.template_file + "'";
    }
    auto temp_opt = Template::From(temp_fin, config.header_lines, config.template_width, config.template_height);
    if (!temp_opt.has_value()) {
        throw std::string("Failed to parse template file due to above reasons");
    }
    templte = temp_opt.value();
}